

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

RBFTransactionState __thiscall
node::anon_unknown_2::ChainImpl::isRBFOptIn(ChainImpl *this,CTransaction *tx)

{
  CTxMemPool *pCVar1;
  RBFTransactionState RVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock36;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar1 = (this->m_node->mempool)._M_t.
           super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
           super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (pCVar1 == (CTxMemPool *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      RVar2 = IsRBFOptInEmptyMempool(tx);
      return RVar2;
    }
  }
  else {
    local_28._M_device = &(pCVar1->cs).super_recursive_mutex;
    local_28._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_28);
    RVar2 = IsRBFOptIn(tx,(this->m_node->mempool)._M_t.
                          super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return RVar2;
    }
  }
  __stack_chk_fail();
}

Assistant:

RBFTransactionState isRBFOptIn(const CTransaction& tx) override
    {
        if (!m_node.mempool) return IsRBFOptInEmptyMempool(tx);
        LOCK(m_node.mempool->cs);
        return IsRBFOptIn(tx, *m_node.mempool);
    }